

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contour.cpp
# Opt level: O2

void __thiscall PathBuilder::write_out(PathBuilder *this,ostream *out)

{
  pointer pdVar1;
  _Elt_pointer pPVar2;
  bool bVar3;
  ostream *poVar4;
  _Elt_pointer pPVar5;
  Point *point;
  _Elt_pointer pPVar6;
  int iVar7;
  pointer pdVar8;
  _Map_pointer local_48;
  
  pdVar1 = (this->paths).
           super__Vector_base<std::deque<Point,_std::allocator<Point>_>,_std::allocator<std::deque<Point,_std::allocator<Point>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pdVar8 = (this->paths).
                super__Vector_base<std::deque<Point,_std::allocator<Point>_>,_std::allocator<std::deque<Point,_std::allocator<Point>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pdVar8 != pdVar1; pdVar8 = pdVar8 + 1) {
    if ((pdVar8->super__Deque_base<Point,_std::allocator<Point>_>)._M_impl.super__Deque_impl_data.
        _M_finish._M_cur !=
        (pdVar8->super__Deque_base<Point,_std::allocator<Point>_>)._M_impl.super__Deque_impl_data.
        _M_start._M_cur) {
      *(undefined8 *)(out + *(long *)(*(long *)out + -0x18) + 8) = 4;
      std::operator<<(out,"<path d=\"M");
      pPVar6 = (pdVar8->super__Deque_base<Point,_std::allocator<Point>_>)._M_impl.
               super__Deque_impl_data._M_start._M_cur;
      pPVar5 = (pdVar8->super__Deque_base<Point,_std::allocator<Point>_>)._M_impl.
               super__Deque_impl_data._M_start._M_last;
      local_48 = (pdVar8->super__Deque_base<Point,_std::allocator<Point>_>)._M_impl.
                 super__Deque_impl_data._M_start._M_node;
      pPVar2 = (pdVar8->super__Deque_base<Point,_std::allocator<Point>_>)._M_impl.
               super__Deque_impl_data._M_finish._M_cur;
      iVar7 = 0;
      while (pPVar6 != pPVar2) {
        if (iVar7 == 1) {
          std::operator<<(out,"L");
        }
        poVar4 = (ostream *)std::ostream::operator<<(out,pPVar6->x);
        poVar4 = std::operator<<(poVar4," ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,pPVar6->y);
        std::operator<<(poVar4," ");
        iVar7 = iVar7 + 1;
        pPVar6 = pPVar6 + 1;
        if (pPVar6 == pPVar5) {
          pPVar6 = local_48[1];
          local_48 = local_48 + 1;
          pPVar5 = pPVar6 + 0x40;
        }
      }
      pPVar5 = (pdVar8->super__Deque_base<Point,_std::allocator<Point>_>)._M_impl.
               super__Deque_impl_data._M_finish._M_cur;
      if (pPVar5 == (pdVar8->super__Deque_base<Point,_std::allocator<Point>_>)._M_impl.
                    super__Deque_impl_data._M_finish._M_first) {
        pPVar5 = (pdVar8->super__Deque_base<Point,_std::allocator<Point>_>)._M_impl.
                 super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
      }
      bVar3 = Point::operator==((pdVar8->super__Deque_base<Point,_std::allocator<Point>_>)._M_impl.
                                super__Deque_impl_data._M_start._M_cur,pPVar5 + -1);
      if (bVar3) {
        std::operator<<(out," Z");
      }
      std::operator<<(out,"\" />\n");
    }
  }
  return;
}

Assistant:

void PathBuilder::write_out(std::ostream &out) const {
    for (const auto &path : paths) {
        if (path.empty()) {
            continue;
        }
        out << std::setprecision(4);
        out<<"<path d=\"M";
        int count = 0;
        for (const auto &point : path) {
            if (count == 1) {
                out<<"L";
            }
            out<<point.x<<" "<<point.y<<" ";
            count++;
        }
        if (path.front() == path.back()) {
            out<<" Z";
        }
        out<<"\" />\n";
    }
}